

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_dc_predictor_4x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  uVar1 = *(ulong *)above;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2._12_2_ = (short)(uVar1 >> 0x30);
  auVar4._8_2_ = (short)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._10_4_ = auVar2._10_4_;
  auVar8._6_8_ = 0;
  auVar8._0_6_ = auVar4._8_6_;
  auVar6._4_2_ = (short)(uVar1 >> 0x10);
  auVar6._0_4_ = (uint)uVar1;
  auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
  iVar15 = (auVar2._10_4_ >> 0x10) + auVar6._4_4_ + auVar4._8_4_ + ((uint)uVar1 & 0xffff);
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  lVar10 = 0;
  do {
    uVar1 = *(ulong *)(left + lVar10);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar5._8_2_ = (short)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar1 >> 0x10);
    auVar7._0_4_ = (uint)uVar1;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    iVar15 = iVar15 + ((uint)uVar1 & 0xffff);
    iVar12 = iVar12 + auVar7._4_4_;
    iVar13 = iVar13 + auVar5._8_4_;
    iVar14 = iVar14 + (auVar3._10_4_ >> 0x10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 8);
  auVar11 = ZEXT416((iVar14 + iVar12 + iVar13 + iVar15 + 6U >> 2) * 0xaaab >> 0x11);
  auVar11 = pshuflw(auVar11,auVar11,0);
  iVar15 = 8;
  do {
    *(long *)dst = auVar11._0_8_;
    dst = dst + stride;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  return;
}

Assistant:

static inline void highbd_dc_predictor_rect(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd,
                                            int shift1, uint32_t multiplier) {
  int sum = 0;
  (void)bd;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, HIGHBD_DC_SHIFT2);
  assert(expected_dc < (1 << bd));

  for (int r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}